

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkTreePage(IntegrityCk *pCheck,int iPage,char *zParentContext,i64 *pnParentMinKey,
                 i64 *pnParentMaxKey)

{
  u8 uVar1;
  u8 uVar2;
  u32 uVar3;
  BtShared *pBt_00;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  ushort uVar8;
  u8 *puVar9;
  u16 uVar10;
  int iVar11;
  uint uVar12;
  u32 uVar13;
  uint uVar14;
  u8 *puVar15;
  bool bVar16;
  u8 **local_198;
  u8 **local_178;
  int local_150;
  int j_1;
  int size_1;
  int j;
  u32 size;
  int pc;
  int contentOffset;
  Pgno pgnoOvfl;
  int nPage;
  CellInfo info;
  u32 sz;
  u8 *pCell;
  i64 nMaxKey;
  i64 nMinKey;
  char *hit;
  char zContext [100];
  int usableSize;
  BtShared *pBt;
  u8 *data;
  int nCell;
  int cellStart;
  int hdr;
  int cnt;
  int pgno;
  int d2;
  int depth;
  int rc;
  int i;
  MemPage *pPage;
  i64 *pnParentMaxKey_local;
  i64 *pnParentMinKey_local;
  char *zParentContext_local;
  IntegrityCk *pIStack_18;
  int iPage_local;
  IntegrityCk *pCheck_local;
  
  nMinKey = 0;
  nMaxKey = 0;
  pCell = (u8 *)0x0;
  pPage = (MemPage *)pnParentMaxKey;
  pnParentMaxKey_local = pnParentMinKey;
  pnParentMinKey_local = (i64 *)zParentContext;
  zParentContext_local._4_4_ = iPage;
  pIStack_18 = pCheck;
  sqlite3_snprintf(100,(char *)&hit,"Page %d: ",(ulong)(uint)iPage);
  pBt_00 = pIStack_18->pBt;
  uVar3 = pBt_00->usableSize;
  if (zParentContext_local._4_4_ == 0) {
    pCheck_local._4_4_ = 0;
  }
  else {
    iVar11 = checkRef(pIStack_18,zParentContext_local._4_4_,(char *)pnParentMinKey_local);
    if (iVar11 == 0) {
      uVar12 = btreeGetPage(pBt_00,zParentContext_local._4_4_,(MemPage **)&rc,0,0);
      if (uVar12 == 0) {
        _rc->isInit = '\0';
        uVar12 = btreeInitPage(_rc);
        if (uVar12 == 0) {
          pgno = 0;
          depth = 0;
          while( true ) {
            bVar16 = false;
            if (depth < (int)(uint)_rc->nCell) {
              bVar16 = pIStack_18->mxErr != 0;
            }
            if (!bVar16) break;
            sqlite3_snprintf(100,(char *)&hit,"On tree page %d cell %d: ",
                             (ulong)zParentContext_local._4_4_,(ulong)(uint)depth);
            puVar15 = _rc->aData +
                      (int)(uint)(_rc->maskPage &
                                 CONCAT11(_rc->aCellIdx[depth << 1],
                                          _rc->aCellIdx[(long)(depth << 1) + 1]));
            btreeParseCellPtr(_rc,puVar15,(CellInfo *)&pgnoOvfl);
            info.iOverflow = info.pCell._0_2_;
            info.nSize = info.pCell._2_2_;
            if (_rc->intKey == '\0') {
              info._28_4_ = (int)_pgnoOvfl + (int)info.pCell;
              puVar9 = pCell;
            }
            else if (depth == 0) {
              nMaxKey = (i64)_pgnoOvfl;
              puVar9 = _pgnoOvfl;
            }
            else {
              puVar9 = _pgnoOvfl;
              if ((long)_pgnoOvfl <= (long)pCell) {
                checkAppendMsg(pIStack_18,(char *)&hit,"Rowid %lld out of order (previous was %lld)"
                               ,_pgnoOvfl,pCell);
                puVar9 = _pgnoOvfl;
              }
            }
            pCell = puVar9;
            if (((uint)info.nData._2_2_ < (uint)info._28_4_) &&
               (puVar15 + (ushort)info.nPayload <= _rc->aData + pBt_00->usableSize)) {
              iVar11 = info._28_4_ - (uint)info.nData._2_2_;
              uVar13 = sqlite3Get4byte(puVar15 + (ushort)info.nPayload);
              if (pBt_00->autoVacuum != '\0') {
                checkPtrmap(pIStack_18,uVar13,'\x03',zParentContext_local._4_4_,(char *)&hit);
              }
              checkList(pIStack_18,0,uVar13,((iVar11 + uVar3) - 5) / (uVar3 - 4),(char *)&hit);
            }
            iVar11 = pgno;
            if (_rc->leaf == '\0') {
              uVar13 = sqlite3Get4byte(puVar15);
              if (pBt_00->autoVacuum != '\0') {
                checkPtrmap(pIStack_18,uVar13,'\x05',zParentContext_local._4_4_,(char *)&hit);
              }
              if (depth == 0) {
                local_178 = (u8 **)0x0;
              }
              else {
                local_178 = &pCell;
              }
              iVar11 = checkTreePage(pIStack_18,uVar13,(char *)&hit,&nMaxKey,(i64 *)local_178);
              if ((0 < depth) && (iVar11 != pgno)) {
                checkAppendMsg(pIStack_18,(char *)&hit,"Child page depth differs");
              }
            }
            pgno = iVar11;
            depth = depth + 1;
          }
          if (_rc->leaf == '\0') {
            uVar13 = sqlite3Get4byte(_rc->aData + (int)(_rc->hdrOffset + 8));
            sqlite3_snprintf(100,(char *)&hit,"On page %d at right child: ",
                             (ulong)zParentContext_local._4_4_);
            if (pBt_00->autoVacuum != '\0') {
              checkPtrmap(pIStack_18,uVar13,'\x05',zParentContext_local._4_4_,(char *)&hit);
            }
            if (_rc->nCell == 0) {
              local_198 = (u8 **)0x0;
            }
            else {
              local_198 = &pCell;
            }
            checkTreePage(pIStack_18,uVar13,(char *)&hit,(i64 *)0x0,(i64 *)local_198);
          }
          if ((_rc->leaf != '\0') && (_rc->intKey != '\0')) {
            if (pnParentMaxKey_local == (i64 *)0x0) {
              if ((pPage != (MemPage *)0x0) &&
                 (lVar6._0_1_ = pPage->isInit, lVar6._1_1_ = pPage->nOverflow,
                 lVar6._2_1_ = pPage->intKey, lVar6._3_1_ = pPage->leaf,
                 lVar6._4_1_ = pPage->hasData, lVar6._5_1_ = pPage->hdrOffset,
                 lVar6._6_1_ = pPage->childPtrSize, lVar6._7_1_ = pPage->max1bytePayload,
                 nMaxKey <= lVar6)) {
                uVar7._0_1_ = pPage->isInit;
                uVar7._1_1_ = pPage->nOverflow;
                uVar7._2_1_ = pPage->intKey;
                uVar7._3_1_ = pPage->leaf;
                uVar7._4_1_ = pPage->hasData;
                uVar7._5_1_ = pPage->hdrOffset;
                uVar7._6_1_ = pPage->childPtrSize;
                uVar7._7_1_ = pPage->max1bytePayload;
                checkAppendMsg(pIStack_18,(char *)&hit,
                               "Rowid %lld out of order (min less than parent max of %lld)",nMaxKey,
                               uVar7);
              }
            }
            else if (pPage == (MemPage *)0x0) {
              if (*pnParentMaxKey_local < (long)pCell) {
                checkAppendMsg(pIStack_18,(char *)&hit,
                               "Rowid %lld out of order (max larger than parent min of %lld)",pCell,
                               *pnParentMaxKey_local);
              }
            }
            else {
              if (nMaxKey <= *pnParentMaxKey_local) {
                checkAppendMsg(pIStack_18,(char *)&hit,
                               "Rowid %lld out of order (min less than parent min of %lld)",nMaxKey,
                               *pnParentMaxKey_local);
              }
              lVar4._0_1_ = pPage->isInit;
              lVar4._1_1_ = pPage->nOverflow;
              lVar4._2_1_ = pPage->intKey;
              lVar4._3_1_ = pPage->leaf;
              lVar4._4_1_ = pPage->hasData;
              lVar4._5_1_ = pPage->hdrOffset;
              lVar4._6_1_ = pPage->childPtrSize;
              lVar4._7_1_ = pPage->max1bytePayload;
              if (lVar4 < (long)pCell) {
                uVar5._0_1_ = pPage->isInit;
                uVar5._1_1_ = pPage->nOverflow;
                uVar5._2_1_ = pPage->intKey;
                uVar5._3_1_ = pPage->leaf;
                uVar5._4_1_ = pPage->hasData;
                uVar5._5_1_ = pPage->hdrOffset;
                uVar5._6_1_ = pPage->childPtrSize;
                uVar5._7_1_ = pPage->max1bytePayload;
                checkAppendMsg(pIStack_18,(char *)&hit,
                               "Rowid %lld out of order (max larger than parent max of %lld)",pCell,
                               uVar5);
              }
              *pnParentMaxKey_local = (i64)pCell;
            }
          }
          puVar15 = _rc->aData;
          uVar12 = (uint)_rc->hdrOffset;
          nMinKey = (i64)sqlite3PageMalloc(pBt_00->pageSize);
          if ((void *)nMinKey == (void *)0x0) {
            pIStack_18->mallocFailed = 1;
          }
          else {
            iVar11 = (CONCAT11(puVar15[(int)(uVar12 + 5)],puVar15[(long)(int)(uVar12 + 5) + 1]) - 1
                     & 0xffff) + 1;
            memset((void *)(nMinKey + iVar11),0,(long)(int)(uVar3 - iVar11));
            memset((void *)nMinKey,1,(long)iVar11);
            uVar1 = puVar15[(int)(uVar12 + 3)];
            uVar2 = puVar15[(long)(int)(uVar12 + 3) + 1];
            iVar11 = uVar12 + 0xc + (uint)_rc->leaf * -4;
            for (depth = 0; depth < (int)(uint)CONCAT11(uVar1,uVar2); depth = depth + 1) {
              uVar14 = (uint)CONCAT11(puVar15[iVar11 + depth * 2],
                                      puVar15[(long)(iVar11 + depth * 2) + 1]);
              size_1 = 0x10000;
              if ((int)uVar14 <= (int)(uVar3 - 4)) {
                uVar10 = cellSizePtr(_rc,puVar15 + (int)uVar14);
                size_1 = (int)uVar10;
              }
              if ((int)(uVar14 + size_1 + -1) < (int)uVar3) {
                j_1 = uVar14 + size_1;
                while (j_1 = j_1 + -1, (int)uVar14 <= j_1) {
                  *(char *)(nMinKey + j_1) = *(char *)(nMinKey + j_1) + '\x01';
                }
              }
              else {
                checkAppendMsg(pIStack_18,(char *)0x0,"Corruption detected in cell %d on page %d",
                               (ulong)(uint)depth,(ulong)zParentContext_local._4_4_);
              }
            }
            uVar8 = CONCAT11(puVar15[(int)(uVar12 + 1)],puVar15[(long)(int)(uVar12 + 1) + 1]);
            while (depth = (int)uVar8, depth != 0) {
              local_150 = depth + (uint)CONCAT11(puVar15[depth + 2],puVar15[(long)(depth + 2) + 1]);
              while (local_150 = local_150 + -1, depth <= local_150) {
                *(char *)(nMinKey + local_150) = *(char *)(nMinKey + local_150) + '\x01';
              }
              uVar8 = CONCAT11(puVar15[depth],puVar15[(long)depth + 1]);
            }
            cellStart = 0;
            for (depth = 0; depth < (int)uVar3; depth = depth + 1) {
              if (*(char *)(nMinKey + depth) == '\0') {
                cellStart = cellStart + 1;
              }
              else if ('\x01' < *(char *)(nMinKey + depth)) {
                checkAppendMsg(pIStack_18,(char *)0x0,"Multiple uses for byte %d of page %d",
                               (ulong)(uint)depth,(ulong)zParentContext_local._4_4_);
                break;
              }
            }
            if (cellStart != (uint)puVar15[(int)(uVar12 + 7)]) {
              checkAppendMsg(pIStack_18,(char *)0x0,
                             "Fragmentation of %d bytes reported as %d on page %d",
                             (ulong)(uint)cellStart,(ulong)puVar15[(int)(uVar12 + 7)],
                             (ulong)zParentContext_local._4_4_);
            }
          }
          sqlite3PageFree((void *)nMinKey);
          releasePage(_rc);
          pCheck_local._4_4_ = pgno + 1;
        }
        else {
          checkAppendMsg(pIStack_18,(char *)&hit,"btreeInitPage() returns error code %d",
                         (ulong)uVar12);
          releasePage(_rc);
          pCheck_local._4_4_ = 0;
        }
      }
      else {
        checkAppendMsg(pIStack_18,(char *)&hit,"unable to get the page. error code=%d",(ulong)uVar12
                      );
        pCheck_local._4_4_ = 0;
      }
    }
    else {
      pCheck_local._4_4_ = 0;
    }
  }
  return pCheck_local._4_4_;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  char *zParentContext, /* Parent context */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char zContext[100];
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;

  sqlite3_snprintf(sizeof(zContext), zContext, "Page %d: ", iPage);

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage, zParentContext) ) return 0;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0, 0))!=0 ){
    checkAppendMsg(pCheck, zContext,
       "unable to get the page. error code=%d", rc);
    return 0;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck, zContext, 
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    return 0;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    sqlite3_snprintf(sizeof(zContext), zContext,
             "On tree page %d cell %d: ", iPage, i);
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nData;
    if( !pPage->intKey ) sz += (int)info.nKey;
    /* For intKey pages, check that the keys are in order.
    */
    else if( i==0 ) nMinKey = nMaxKey = info.nKey;
    else{
      if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    assert( sz==info.nPayload );
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage, zContext);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage, zContext);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, zContext, &nMinKey, i==0 ? NULL : &nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, zContext, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    sqlite3_snprintf(sizeof(zContext), zContext, 
                     "On page %d at right child: ", iPage);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
    }
#endif
    checkTreePage(pCheck, pgno, zContext, NULL, !pPage->nCell ? NULL : &nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    nCell = get2byte(&data[hdr+3]);
    cellStart = hdr + 12 - 4*pPage->leaf;
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        checkAppendMsg(pCheck, 0, 
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      j = get2byte(&data[i]);
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck, 0,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck, 0, 
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);
  return depth+1;
}